

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceSwapFieldTest_ReflectionSwapFieldRepeatedExplicitZeroTest_Test::TestBody
          (NoFieldPresenceSwapFieldTest_ReflectionSwapFieldRepeatedExplicitZeroTest_Test *this)

{
  TestAllTypes *message1;
  TestAllTypes *message2;
  Reflection *pRVar1;
  void *pvVar2;
  int iVar3;
  FieldDescriptor *field;
  AssertHelper *message;
  AssertHelper *message_00;
  char *pcVar4;
  string_view field_name;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l_00;
  initializer_list<int> rhs;
  initializer_list<int> rhs_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertHelper local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  pointer pBStack_90;
  pointer local_88;
  testing local_79;
  RepeatedField<int> *local_78;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>
  local_70;
  UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>
  local_50;
  
  message = &local_b8;
  message_00 = &local_b8;
  local_78 = &(this->super_NoFieldPresenceSwapFieldTest).m1_.field_0._impl_.repeated_int32_;
  RepeatedField<int>::Add(local_78,0);
  field_name._M_str = "repeated_int32";
  field_name._M_len = 0xe;
  field = NoFieldPresenceSwapFieldTest::FindFieldByName
                    (&this->super_NoFieldPresenceSwapFieldTest,field_name);
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r1_;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_b0;
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)field;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_a0,__l,(allocator_type *)&local_b8);
  message1 = &(this->super_NoFieldPresenceSwapFieldTest).m1_;
  message2 = &(this->super_NoFieldPresenceSwapFieldTest).m2_;
  Reflection::SwapFields
            (pRVar1,&message1->super_Message,&message2->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_a0);
  pvVar2 = (void *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)pBStack_90 - (long)pvVar2);
  }
  iVar3 = Reflection::FieldSize
                    ((this->super_NoFieldPresenceSwapFieldTest).r1_,&message1->super_Message,field);
  local_b0._M_head_impl._0_4_ = iVar3;
  local_b8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"r1_->FieldSize(m1_, f)","0",(int *)&local_b0,(int *)&local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x1f7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  iVar3 = Reflection::FieldSize
                    ((this->super_NoFieldPresenceSwapFieldTest).r2_,&message2->super_Message,field);
  local_b0._M_head_impl._0_4_ = iVar3;
  local_b8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"r2_->FieldSize(m2_, f)","1",(int *)&local_b0,(int *)&local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (AssertHelper *)(anon_var_dwarf_a12c75 + 5);
    }
    else {
      message = (AssertHelper *)(local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x1f8,(char *)message);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>::
  operator()(local_a0,(char *)&local_b0,(RepeatedField<int> *)"m1_.repeated_int32()");
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (AssertHelper *)(anon_var_dwarf_a12c75 + 5);
    }
    else {
      message = (AssertHelper *)(local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x1f9,(char *)message);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  local_b8.data_._0_4_ = 0;
  rhs._M_len = (size_type)message;
  rhs._M_array = (iterator)0x1;
  testing::UnorderedPointwise<testing::internal::Eq2Matcher,int>
            (&local_50,&local_79,(Eq2Matcher *)&local_b8,rhs);
  local_88 = local_50.matchers_.
             super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pBStack_90 = local_50.matchers_.
               super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_50.matchers_.
             super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_50.matchers_.
  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.matchers_.
  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.matchers_.
  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0._0_4_ = local_50.match_flags_;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,int>>>
  ::operator()(&local_b0,local_a0,(RepeatedField<int> *)"m2_.repeated_int32()");
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_50.matchers_.
      super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.matchers_.
                    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.matchers_.
                          super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.matchers_.
                          super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_b0._M_head_impl == '\0') {
    testing::Message::Message((Message *)local_a0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x1fa,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((long *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a0._4_4_,local_a0._0_4_) + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  pRVar1 = (this->super_NoFieldPresenceSwapFieldTest).r2_;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_b0;
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)field;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_a0,__l_00,(allocator_type *)&local_b8);
  Reflection::SwapFields
            (pRVar1,&message1->super_Message,&message2->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_a0);
  pvVar2 = (void *)CONCAT44(local_a0._4_4_,local_a0._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)pBStack_90 - (long)pvVar2);
  }
  iVar3 = Reflection::FieldSize
                    ((this->super_NoFieldPresenceSwapFieldTest).r1_,&message1->super_Message,field);
  local_b0._M_head_impl._0_4_ = iVar3;
  local_b8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"r1_->FieldSize(m1_, f)","1",(int *)&local_b0,(int *)&local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x201,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  iVar3 = Reflection::FieldSize
                    ((this->super_NoFieldPresenceSwapFieldTest).r2_,&message2->super_Message,field);
  local_b0._M_head_impl._0_4_ = iVar3;
  local_b8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"r2_->FieldSize(m2_, f)","0",(int *)&local_b0,(int *)&local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = (AssertHelper *)(anon_var_dwarf_a12c75 + 5);
    }
    else {
      message_00 = (AssertHelper *)(local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x202,(char *)message_00);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  local_b8.data_._0_4_ = 0;
  rhs_00._M_len = (size_type)message_00;
  rhs_00._M_array = (iterator)0x1;
  testing::UnorderedPointwise<testing::internal::Eq2Matcher,int>
            (&local_70,&local_79,(Eq2Matcher *)&local_b8,rhs_00);
  local_88 = local_70.matchers_.
             super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pBStack_90 = local_70.matchers_.
               super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_70.matchers_.
             super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_70.matchers_.
  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.matchers_.
  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.matchers_.
  super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0._0_4_ = local_70.match_flags_;
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,int>>>
  ::operator()(&local_b0,local_a0,(RepeatedField<int> *)"m1_.repeated_int32()");
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_70.matchers_.
      super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.matchers_.
                    super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.matchers_.
                          super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.matchers_.
                          super__Vector_base<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>,_std::allocator<testing::internal::BoundSecondMatcher<testing::internal::Eq2Matcher,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_b0._M_head_impl == '\0') {
    testing::Message::Message((Message *)local_a0);
    if (local_a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x203,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((long *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a0._4_4_,local_a0._0_4_) + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::IsEmptyMatcher>>::
  operator()(local_a0,(char *)&local_b0,(RepeatedField<int> *)"m2_.repeated_int32()");
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_98->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x204,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,local_98);
  }
  return;
}

Assistant:

TEST_F(NoFieldPresenceSwapFieldTest,
       ReflectionSwapFieldRepeatedExplicitZeroTest) {
  // For repeated fields, explicitly adding zero would cause it to be added into
  // the repeated field.
  m1_.add_repeated_int32(0);

  const FieldDescriptor* f = FindFieldByName("repeated_int32");
  r1_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped.
  EXPECT_EQ(r1_->FieldSize(m1_, f), 0);
  EXPECT_EQ(r2_->FieldSize(m2_, f), 1);
  EXPECT_THAT(m1_.repeated_int32(), IsEmpty());
  EXPECT_THAT(m2_.repeated_int32(), UnorderedPointwise(Eq(), {0}));

  // It doesn't matter which reflection or descriptor gets used; swapping should
  // still work if m2_'s descriptor is provided.
  r2_->SwapFields(&m1_, &m2_, /*fields=*/{f});

  // Fields should be swapped again.
  EXPECT_EQ(r1_->FieldSize(m1_, f), 1);
  EXPECT_EQ(r2_->FieldSize(m2_, f), 0);
  EXPECT_THAT(m1_.repeated_int32(), UnorderedPointwise(Eq(), {0}));
  EXPECT_THAT(m2_.repeated_int32(), IsEmpty());
}